

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DoubletonEquationPS::DoubletonEquationPS
          (DoubletonEquationPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int _j,int _k,int _i,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *oldLo,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *oldUp,shared_ptr<soplex::Tolerances> *tols)

{
  cpp_dec_float<200U,_int,_void> *pcVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  bool bVar3;
  type_conflict5 tVar4;
  int iVar5;
  SPxSense SVar6;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint in_ECX;
  uint in_EDX;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  uint in_R8D;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb20;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  undefined8 in_stack_fffffffffffffb28;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffb30;
  int i;
  uint *puVar7;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb38;
  PostStep *in_stack_fffffffffffffb40;
  uint in_stack_fffffffffffffc2c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_354;
  undefined1 local_2d4 [128];
  undefined1 local_254 [128];
  undefined1 local_1d4 [168];
  uint local_12c;
  uint local_128;
  uint local_124;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  uint *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  uint *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  uint *local_c8;
  uint *local_b8;
  uint *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  uint *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  uint *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  uint *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  uint *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  uint *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  uint *local_40;
  uint *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  uint *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  uint *local_10;
  uint *local_8;
  
  local_12c = in_R8D;
  local_128 = in_ECX;
  local_124 = in_EDX;
  local_120 = in_RSI;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffb20,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x7321b2);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x7321c8);
  PostStep::PostStep(in_stack_fffffffffffffb40,(char *)in_stack_fffffffffffffb38,
                     in_stack_fffffffffffffb30,(int)((ulong)in_stack_fffffffffffffb28 >> 0x20),
                     (int)in_stack_fffffffffffffb28);
  i = (int)((ulong)in_stack_fffffffffffffb30 >> 0x20);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x732211);
  *(undefined ***)(in_RDI->m_backend).data._M_elems = &PTR__DoubletonEquationPS_008a0498;
  (in_RDI->m_backend).data._M_elems[10] = local_124;
  (in_RDI->m_backend).data._M_elems[0xb] = local_128;
  (in_RDI->m_backend).data._M_elems[0xc] = local_12c;
  SVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::spxSense(local_120);
  *(bool *)((in_RDI->m_backend).data._M_elems + 0xd) = SVar6 == MAXIMIZE;
  pcVar1 = &in_RDI->m_backend;
  local_110 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lower(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  local_108 = local_1d4;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  local_100 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::upper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  local_f8 = local_254;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x38))(local_2d4);
  bVar3 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_fffffffffffffc30,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffffc2c,iVar5),in_RDI);
  *(bool *)((long)(pcVar1->data)._M_elems + 0x35) = bVar3;
  puVar7 = (in_RDI->m_backend).data._M_elems + 0xe;
  SVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::spxSense(local_120);
  if (SVar6 == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(in_stack_fffffffffffffb38,i);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(in_stack_fffffffffffffb38,i);
    local_28 = &local_354;
    local_20 = puVar7;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,local_28);
    local_18 = local_28;
    local_10 = puVar7;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    local_8 = puVar7;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20);
  }
  puVar7 = in_RDI[1].m_backend.data._M_elems + 0xe;
  SVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::spxSense(local_120);
  if (SVar6 == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(in_stack_fffffffffffffb38,i);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(in_stack_fffffffffffffb38,i);
    local_58 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&stack0xfffffffffffffc2c;
    local_50 = puVar7;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_59,local_58);
    local_48 = local_58;
    local_40 = puVar7;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    local_38 = puVar7;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20);
  }
  pnVar2 = in_RDI + 2;
  this_00 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::colVector(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  local_f0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::value(this_00,0);
  local_e8 = (pnVar2->m_backend).data._M_elems + 0xe;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  pnVar2 = in_RDI + 3;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::lower(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  tVar4 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x732609);
  *(type_conflict5 *)((pnVar2->m_backend).data._M_elems + 0xe) = tVar4;
  pnVar2 = in_RDI + 3;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::upper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  tVar4 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x73266f);
  *(type_conflict5 *)((long)(pnVar2->m_backend).data._M_elems + 0x39) = tVar4;
  pnVar2 = in_RDI + 3;
  local_e0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::lower(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  local_d8 = (pnVar2->m_backend).data._M_elems + 0xf;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  pnVar2 = in_RDI + 4;
  local_d0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::upper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  local_c8 = (pnVar2->m_backend).data._M_elems + 0xf;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  local_b8 = in_RDI[5].m_backend.data._M_elems + 0xf;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  local_a8 = in_RDI[6].m_backend.data._M_elems + 0xf;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  pnVar2 = in_RDI + 7;
  local_a0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::lower(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  local_98 = (pnVar2->m_backend).data._M_elems + 0xf;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  pnVar2 = in_RDI + 8;
  local_90 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::upper(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  local_88 = (pnVar2->m_backend).data._M_elems + 0xf;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  puVar7 = in_RDI[9].m_backend.data._M_elems + 0xf;
  local_80 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::lhs(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  local_78 = puVar7;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  puVar7 = in_RDI[10].m_backend.data._M_elems + 0xf;
  local_70 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::rhs(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  local_68 = puVar7;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffb20,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)(in_RDI[0xb].m_backend.data._M_elems + 0x10);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::colVector(this_01,in_stack_fffffffffffffb1c);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_01,
             (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  return;
}

Assistant:

DoubletonEquationPS(const SPxLPBase<R>& lp, int _j, int _k, int _i, R oldLo, R oldUp,
                          std::shared_ptr<Tolerances> tols)
         : PostStep("DoubletonEquation", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_k(_k)
         , m_i(_i)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_jFixed(EQ(lp.lower(_j), lp.upper(_j), this->epsilon()))
         , m_jObj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_kObj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_k) : -lp.obj(_k))
         , m_aij(lp.colVector(_j).value(0))
         , m_strictLo(lp.lower(_k) > oldLo)
         , m_strictUp(lp.upper(_k) < oldUp)
         , m_newLo(lp.lower(_k))
         , m_newUp(lp.upper(_k))
         , m_oldLo(oldLo)
         , m_oldUp(oldUp)
         , m_Lo_j(lp.lower(_j))
         , m_Up_j(lp.upper(_j))
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_col(lp.colVector(_k))
      {}